

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ebmlmain.c
# Opt level: O2

uint8_t EBML_CodedValueLengthSigned(filepos_t Length,size_t CodedSize,uint8_t *OutBuffer)

{
  uint8_t uVar1;
  ulong Length_00;
  
  Length_00 = Length + 0x3fU;
  if ((((0x7e < Length + 0x3fU) && (Length_00 = Length + 0x1fffU, 0x3ffe < Length + 0x1fffU)) &&
      (Length_00 = Length + 0xfffffU, 0x1ffffe < Length + 0xfffffU)) &&
     (Length_00 = Length, Length + 0x7ffffffU < 0xfffffff)) {
    Length_00 = Length + 0x7ffffffU;
  }
  uVar1 = EBML_CodedValueLength(Length_00,CodedSize,OutBuffer,1);
  return uVar1;
}

Assistant:

uint8_t EBML_CodedValueLengthSigned(filepos_t Length, size_t CodedSize, uint8_t * OutBuffer)
{
    if (Length > -64 && Length < 64) // 2^6
        Length += 63;
    else if (Length > -8192 && Length < 8192) // 2^13
        Length += 8191;
    else if (Length > -1048576 && Length < 1048576) // 2^20
        Length += 1048575;
    else if (Length > -134217728 && Length < 134217728) // 2^27
        Length += 134217727;

    return EBML_CodedValueLength(Length, CodedSize, OutBuffer, 1);
}